

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

UDate __thiscall
icu_63::CalendarAstronomer::getMoonTime(CalendarAstronomer *this,double desired,UBool next)

{
  UDate UVar1;
  AngleFunc local_28;
  MoonTimeAngleFunc func;
  UBool next_local;
  double desired_local;
  CalendarAstronomer *this_local;
  
  func.super_AngleFunc._vptr_AngleFunc._7_1_ = next;
  MoonTimeAngleFunc::MoonTimeAngleFunc((MoonTimeAngleFunc *)&local_28);
  UVar1 = timeOfAngle(this,&local_28,desired,29.530588853,60000.0,
                      func.super_AngleFunc._vptr_AngleFunc._7_1_);
  MoonTimeAngleFunc::~MoonTimeAngleFunc((MoonTimeAngleFunc *)&local_28);
  return UVar1;
}

Assistant:

UDate CalendarAstronomer::getMoonTime(double desired, UBool next)
{
    MoonTimeAngleFunc func;
    return timeOfAngle( func,
                        desired,
                        SYNODIC_MONTH,
                        MINUTE_MS,
                        next);
}